

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O3

void dumpeasysrc(GlobalConfig *config)

{
  char *__filename;
  curl_slist *pcVar1;
  bool bVar2;
  FILE *__stream;
  long lVar3;
  
  __filename = config->libcurl;
  if ((*__filename == '-') && (__filename[1] == '\0')) {
    bVar2 = true;
    __stream = _stdout;
  }
  else {
    __stream = fopen64(__filename,"w");
    bVar2 = false;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to open %s to write libcurl code",__filename);
  }
  else {
    lVar3 = 0;
    do {
      curl_mfprintf(__stream,"%s\n",*(undefined8 *)((long)srchead + lVar3));
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x50);
    if (easysrc_decl != (slist_wc *)0x0) {
      for (pcVar1 = easysrc_decl->first; pcVar1 != (curl_slist *)0x0; pcVar1 = pcVar1->next) {
        curl_mfprintf(__stream,"  %s\n",pcVar1->data);
      }
    }
    if (easysrc_data != (slist_wc *)0x0) {
      curl_mfprintf(__stream,"\n");
      for (pcVar1 = easysrc_data->first; pcVar1 != (curl_slist *)0x0; pcVar1 = pcVar1->next) {
        curl_mfprintf(__stream,"  %s\n",pcVar1->data);
      }
    }
    curl_mfprintf(__stream,"\n");
    if (easysrc_code != (slist_wc *)0x0) {
      for (pcVar1 = easysrc_code->first; pcVar1 != (curl_slist *)0x0; pcVar1 = pcVar1->next) {
        if (*pcVar1->data == '\0') {
          curl_mfprintf(__stream,"\n");
        }
        else {
          curl_mfprintf(__stream,"  %s\n");
        }
      }
    }
    if (easysrc_clean != (slist_wc *)0x0) {
      for (pcVar1 = easysrc_clean->first; pcVar1 != (curl_slist *)0x0; pcVar1 = pcVar1->next) {
        curl_mfprintf(__stream,"  %s\n",pcVar1->data);
      }
    }
    lVar3 = 0;
    do {
      curl_mfprintf(__stream,"%s\n",*(undefined8 *)((long)srcend + lVar3));
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    if (!bVar2) {
      fclose(__stream);
    }
  }
  easysrc_free();
  return;
}

Assistant:

void dumpeasysrc(struct GlobalConfig *config)
{
  struct curl_slist *ptr;
  char *o = config->libcurl;

  FILE *out;
  bool fopened = FALSE;
  if(strcmp(o, "-")) {
    out = fopen(o, FOPEN_WRITETEXT);
    fopened = TRUE;
  }
  else
    out = stdout;
  if(!out)
    warnf(config, "Failed to open %s to write libcurl code", o);
  else {
    int i;
    const char *c;

    for(i = 0; ((c = srchead[i]) != NULL); i++)
      fprintf(out, "%s\n", c);

    /* Declare variables used for complex setopt values */
    if(easysrc_decl) {
      for(ptr = easysrc_decl->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    /* Set up complex values for setopt calls */
    if(easysrc_data) {
      fprintf(out, "\n");

      for(ptr = easysrc_data->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    fprintf(out, "\n");
    if(easysrc_code) {
      for(ptr = easysrc_code->first; ptr; ptr = ptr->next) {
        if(ptr->data[0]) {
          fprintf(out, "  %s\n", ptr->data);
        }
        else {
          fprintf(out, "\n");
        }
      }
    }

    if(easysrc_clean) {
      for(ptr = easysrc_clean->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    for(i = 0; ((c = srcend[i]) != NULL); i++)
      fprintf(out, "%s\n", c);

    if(fopened)
      fclose(out);
  }

  easysrc_free();
}